

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

uint nullcGetFunctionType(uint funcID)

{
  ExternFuncInfo *pEVar1;
  
  if (NULLCTypeInfo::linker != 0) {
    pEVar1 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(NULLCTypeInfo::linker + 0x240),
                        funcID);
    return pEVar1->funcType;
  }
  __assert_fail("NULLCTypeInfo::linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x1e1,"unsigned int nullcGetFunctionType(unsigned int)");
}

Assistant:

unsigned int	nullcGetFunctionType(unsigned int funcID)
{
	assert(NULLCTypeInfo::linker);
	return NULLCTypeInfo::linker->exFunctions[funcID].funcType;
}